

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::Generators::GeneratorUntypedBase::~GeneratorUntypedBase(GeneratorUntypedBase *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR___cxa_pure_virtual_002a61c0;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

GeneratorUntypedBase::~GeneratorUntypedBase() = default;